

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.cpp
# Opt level: O2

bool __thiscall OpenMD::Globals::addRestraintStamp(Globals *this,RestraintStamp *rest)

{
  RestraintStamp *local_8;
  
  local_8 = rest;
  std::vector<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_>::push_back
            (&this->restraints_,&local_8);
  return true;
}

Assistant:

bool Globals::addRestraintStamp(RestraintStamp* rest) {
    restraints_.push_back(rest);
    return true;
  }